

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

pair<unsigned_long,_bool> __thiscall CConnman::SocketSendData(CConnman *this,CNode *node)

{
  ConstevalFormatString<2U> fmt;
  string_view source_file;
  bool bVar1;
  uint uVar2;
  reference pCVar3;
  pointer pTVar4;
  __tuple_element_t<1UL,_tuple<Span<const_unsigned_char>,_bool,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>
  *p_Var5;
  uchar *puVar6;
  size_t sVar7;
  LogFlags LVar8;
  int *piVar9;
  __uniq_ptr_impl<Transport,_std::default_delete<Transport>_> args_1;
  undefined8 extraout_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar10;
  int nErr;
  int flags;
  int nBytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_type;
  type *more;
  type *data;
  size_t memusage;
  optional<bool> expected_more;
  bool data_left;
  size_t nSentSize;
  iterator it;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  char *in_stack_fffffffffffffd40;
  int err;
  CNode *in_stack_fffffffffffffd48;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffd70;
  const_iterator *__last;
  CNode *in_stack_fffffffffffffd78;
  const_iterator *__first;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  LogFlags in_stack_fffffffffffffda0;
  element_type *in_stack_fffffffffffffda8;
  int source_line;
  undefined4 in_stack_fffffffffffffde8;
  int iVar11;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffdf0;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffdf8;
  string_view in_stack_fffffffffffffe00;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  const_iterator local_188 [2];
  const_iterator local_148;
  Level in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffef0;
  undefined1 local_71;
  undefined8 local_70;
  undefined8 local_38;
  undefined1 local_30;
  atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_8;
  
  local_8._M_i.__r = *(duration<long,_std::ratio<1L,_1L>_> *)(in_FS_OFFSET + 0x28);
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::begin
            ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
             in_stack_fffffffffffffd40);
  local_70 = (__pthread_internal_list *)0x0;
  local_71 = 0;
  std::optional<bool>::optional
            ((optional<bool> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  while( true ) {
    std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::end
              ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
               in_stack_fffffffffffffd40);
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd48,(_Self *)in_stack_fffffffffffffd40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*>::operator->
                ((_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      sVar7 = CSerializedNetMsg::GetMemoryUsage((CSerializedNetMsg *)in_stack_fffffffffffffd48);
      pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                         ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      pCVar3 = std::_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*>::
               operator*((_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*>
                          *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      uVar2 = (*pTVar4->_vptr_Transport[6])(pTVar4,pCVar3);
      if ((uVar2 & 1) != 0) {
        *(size_t *)(in_RSI + 0x20) = *(long *)(in_RSI + 0x20) - sVar7;
        std::_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*>::
        operator++((_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
    }
    pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::end
              ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
               in_stack_fffffffffffffd40);
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd48,(_Self *)in_stack_fffffffffffffd40);
    (*pTVar4->_vptr_Transport[7])(&stack0xffffffffffffff48,pTVar4,(ulong)((bVar1 ^ 0xff) & 1));
    std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    p_Var5 = std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                       ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    bVar1 = std::optional<bool>::has_value
                      ((optional<bool> *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (bVar1) {
      Span<const_unsigned_char>::empty
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::optional<bool>::operator*
                ((optional<bool> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      inline_assertion_check<false,bool>
                ((bool *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (char *)in_stack_fffffffffffffd50.__r,
                 (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    std::optional<bool>::optional<const_bool_&,_true>
              ((optional<bool> *)in_stack_fffffffffffffd48,(bool *)in_stack_fffffffffffffd40);
    bVar1 = Span<const_unsigned_char>::empty
                      ((Span<const_unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_71 = (bVar1 ^ 0xffU) & 1;
    local_1e4 = 0;
    bVar1 = Span<const_unsigned_char>::empty
                      ((Span<const_unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (!bVar1) {
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffd78,
                 in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd5c,SUB41((uint)in_stack_fffffffffffffd58 >> 0x18,0));
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      if (bVar1) {
        local_1ec = 0x4040;
        if ((*p_Var5 & 1U) != 0) {
          local_1ec = 0xc040;
        }
        in_stack_fffffffffffffda8 =
             std::__shared_ptr_access<Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        puVar6 = Span<const_unsigned_char>::data
                           ((Span<const_unsigned_char> *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        sVar7 = Span<const_unsigned_char>::size
                          ((Span<const_unsigned_char> *)
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        local_1e4 = (*in_stack_fffffffffffffda8->_vptr_Sock[3])
                              (in_stack_fffffffffffffda8,puVar6,sVar7,(ulong)local_1ec);
        local_1e8 = 0;
      }
      else {
        local_1e8 = 3;
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      if (local_1e8 != 0) goto LAB_0020d2bd;
    }
    source_line = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    if (local_1e4 < 1) break;
    in_stack_fffffffffffffdf8 = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
    in_stack_fffffffffffffdf0 =
         std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::operator=
                   ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                    in_stack_fffffffffffffd40,in_stack_fffffffffffffd50);
    *(long *)(in_RSI + 0x28) = (long)local_1e4 + *(long *)(in_RSI + 0x28);
    pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    (*pTVar4->_vptr_Transport[8])(pTVar4,(long)local_1e4);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (!bVar1) {
      CNode::AccountForSentBytes
                (in_stack_fffffffffffffd48,(string *)in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_70 = (long)&((__pthread_internal_list *)local_70)->__prev + (long)local_1e4;
    in_stack_fffffffffffffda0 = (LogFlags)local_1e4;
    LVar8 = Span<const_unsigned_char>::size
                      ((Span<const_unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (in_stack_fffffffffffffda0 != LVar8) {
LAB_0020d2bd:
      pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                         ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      (*pTVar4->_vptr_Transport[9])();
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),false
                );
      std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::end
                ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                 in_stack_fffffffffffffd40);
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd48,(_Self *)in_stack_fffffffffffffd40)
      ;
      if ((bVar1) && (*(long *)(in_RSI + 0x20) != 0)) {
        __assert_fail("node.m_send_memusage == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                      ,0x66c,"std::pair<size_t, bool> CConnman::SocketSendData(CNode &) const");
      }
      std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::begin
                ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                 in_stack_fffffffffffffd40);
      __last = &local_148;
      std::_Deque_iterator<CSerializedNetMsg,CSerializedNetMsg_const&,CSerializedNetMsg_const*>::
      _Deque_iterator<std::_Deque_iterator<CSerializedNetMsg,CSerializedNetMsg&,CSerializedNetMsg*>,void>
                ((_Deque_iterator<CSerializedNetMsg,_const_CSerializedNetMsg_&,_const_CSerializedNetMsg_*>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*> *)
                 0x20d3bd);
      __first = local_188;
      std::_Deque_iterator<CSerializedNetMsg,CSerializedNetMsg_const&,CSerializedNetMsg_const*>::
      _Deque_iterator<std::_Deque_iterator<CSerializedNetMsg,CSerializedNetMsg&,CSerializedNetMsg*>,void>
                ((_Deque_iterator<CSerializedNetMsg,_const_CSerializedNetMsg_&,_const_CSerializedNetMsg_*>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (_Deque_iterator<CSerializedNetMsg,_CSerializedNetMsg_&,_CSerializedNetMsg_*> *)
                 0x20d3d7);
      std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::erase
                ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),__first,__last);
      std::pair<unsigned_long,_bool>::pair<unsigned_long_&,_bool_&,_true>
                ((pair<unsigned_long,_bool> *)in_stack_fffffffffffffd48,
                 (unsigned_long *)in_stack_fffffffffffffd40,
                 (bool *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      if ((duration<long,_std::ratio<1L,_1L>_>)*(long *)(in_FS_OFFSET + 0x28) != local_8._M_i.__r) {
        __stack_chk_fail();
      }
      pVar10._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      pVar10.second = (bool)local_30;
      pVar10.first = local_38;
      return pVar10;
    }
  }
  if (local_1e4 < 0) {
    piVar9 = __errno_location();
    iVar11 = *piVar9;
    if ((((iVar11 != 0xb) && (iVar11 != 0x5a)) && (iVar11 != 4)) && (iVar11 != 0x73)) {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (char *)in_stack_fffffffffffffd50.__r);
        err = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (char *)in_stack_fffffffffffffd50.__r);
        args_1._M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
        super__Head_base<0UL,_Transport_*,_false>._M_head_impl =
             (tuple<Transport_*,_std::default_delete<Transport>_>)
             CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        NetworkErrorString_abi_cxx11_(err);
        in_stack_fffffffffffffd48 = (CNode *)&stack0xfffffffffffffef8;
        in_stack_fffffffffffffd40 = "socket send error for peer=%d: %s\n";
        in_stack_fffffffffffffd38 = 1;
        source_file._M_str = (char *)in_stack_fffffffffffffdf8.__r;
        source_file._M_len = in_stack_fffffffffffffdf0.__r;
        fmt.fmt._4_4_ = iVar11;
        fmt.fmt._0_4_ = in_stack_fffffffffffffde8;
        LogPrintFormatInternal<long,std::__cxx11::string>
                  (in_stack_fffffffffffffe00,source_file,source_line,in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffee0,fmt,in_stack_fffffffffffffef0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   args_1._M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
                   super__Head_base<0UL,_Transport_*,_false>._M_head_impl);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
      CNode::CloseSocketDisconnect(in_stack_fffffffffffffd78);
    }
  }
  goto LAB_0020d2bd;
}

Assistant:

std::pair<size_t, bool> CConnman::SocketSendData(CNode& node) const
{
    auto it = node.vSendMsg.begin();
    size_t nSentSize = 0;
    bool data_left{false}; //!< second return value (whether unsent data remains)
    std::optional<bool> expected_more;

    while (true) {
        if (it != node.vSendMsg.end()) {
            // If possible, move one message from the send queue to the transport. This fails when
            // there is an existing message still being sent, or (for v2 transports) when the
            // handshake has not yet completed.
            size_t memusage = it->GetMemoryUsage();
            if (node.m_transport->SetMessageToSend(*it)) {
                // Update memory usage of send buffer (as *it will be deleted).
                node.m_send_memusage -= memusage;
                ++it;
            }
        }
        const auto& [data, more, msg_type] = node.m_transport->GetBytesToSend(it != node.vSendMsg.end());
        // We rely on the 'more' value returned by GetBytesToSend to correctly predict whether more
        // bytes are still to be sent, to correctly set the MSG_MORE flag. As a sanity check,
        // verify that the previously returned 'more' was correct.
        if (expected_more.has_value()) Assume(!data.empty() == *expected_more);
        expected_more = more;
        data_left = !data.empty(); // will be overwritten on next loop if all of data gets sent
        int nBytes = 0;
        if (!data.empty()) {
            LOCK(node.m_sock_mutex);
            // There is no socket in case we've already disconnected, or in test cases without
            // real connections. In these cases, we bail out immediately and just leave things
            // in the send queue and transport.
            if (!node.m_sock) {
                break;
            }
            int flags = MSG_NOSIGNAL | MSG_DONTWAIT;
#ifdef MSG_MORE
            if (more) {
                flags |= MSG_MORE;
            }
#endif
            nBytes = node.m_sock->Send(reinterpret_cast<const char*>(data.data()), data.size(), flags);
        }
        if (nBytes > 0) {
            node.m_last_send = GetTime<std::chrono::seconds>();
            node.nSendBytes += nBytes;
            // Notify transport that bytes have been processed.
            node.m_transport->MarkBytesSent(nBytes);
            // Update statistics per message type.
            if (!msg_type.empty()) { // don't report v2 handshake bytes for now
                node.AccountForSentBytes(msg_type, nBytes);
            }
            nSentSize += nBytes;
            if ((size_t)nBytes != data.size()) {
                // could not send full message; stop sending more
                break;
            }
        } else {
            if (nBytes < 0) {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS) {
                    LogDebug(BCLog::NET, "socket send error for peer=%d: %s\n", node.GetId(), NetworkErrorString(nErr));
                    node.CloseSocketDisconnect();
                }
            }
            break;
        }
    }

    node.fPauseSend = node.m_send_memusage + node.m_transport->GetSendMemoryUsage() > nSendBufferMaxSize;

    if (it == node.vSendMsg.end()) {
        assert(node.m_send_memusage == 0);
    }
    node.vSendMsg.erase(node.vSendMsg.begin(), it);
    return {nSentSize, data_left};
}